

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QMetaType::
     registerMutableViewImpl<QList<std::pair<QString,QFileInfo>>,QIterable<QMetaSequence>>
               (MutableViewFunction *view,QMetaType fromType,QMetaType toType)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  QMetaType *in_RDX;
  QMetaType *in_RSI;
  function *in_RDI;
  long in_FS_OFFSET;
  anon_class_16_2_c632c92a_for_m_func *in_stack_ffffffffffffffa8;
  bool local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = ::QMetaType::registerMutableViewFunction(in_RDI,in_RSI,in_RDX);
  if ((uVar3 & 1) == 0) {
    local_39 = false;
  }
  else {
    if (registerMutableViewImpl<QList<std::pair<QString,QFileInfo>>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
        ::unregister == '\0') {
      iVar2 = __cxa_guard_acquire(&registerMutableViewImpl<QList<std::pair<QString,QFileInfo>>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                                   ::unregister);
      if (iVar2 != 0) {
        qScopeGuard<QMetaType::registerMutableViewImpl<QList<std::pair<QString,QFileInfo>>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)::_lambda()_1_>
                  (in_stack_ffffffffffffffa8);
        __cxa_atexit(QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:688:56)>
                     ::~QScopeGuard,
                     &registerMutableViewImpl<QList<std::pair<QString,_QFileInfo>_>,_QIterable<QMetaSequence>_>
                      ::unregister,&__dso_handle);
        __cxa_guard_release(&registerMutableViewImpl<QList<std::pair<QString,QFileInfo>>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                             ::unregister);
      }
    }
    local_39 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }